

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  EnvironmentType EVar2;
  PlannerType PVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  string searchDir;
  string plannerType;
  string environmentType;
  
  if (argc == 2) {
    pcVar1 = argv[1];
    if (((*pcVar1 == '-') && (pcVar1[1] == 'h')) && (pcVar1[2] == '\0')) {
      PrintHelp(argv);
      return 0;
    }
  }
  else if (argc < 2) {
    PrintUsage(argv);
    return 2;
  }
  lVar5 = 0;
  while ((iVar4 = argc + -1, argc + -1 != (int)lVar5 &&
         (iVar4 = (int)lVar5, *argv[lVar5 + 1] == '-'))) {
    lVar5 = lVar5 + 1;
  }
  CheckIsNavigating(iVar4,argv);
  CheckEnvironmentType_abi_cxx11_(&environmentType,iVar4,argv);
  CheckPlannerType_abi_cxx11_(&plannerType,iVar4,argv);
  CheckSearchDirection_abi_cxx11_(&searchDir,iVar4,argv);
  poVar6 = std::operator<<((ostream *)&std::cout,"Environment: ");
  poVar6 = std::operator<<(poVar6,(string *)&environmentType);
  poVar6 = std::operator<<(poVar6,"; Planner: ");
  poVar6 = std::operator<<(poVar6,(string *)&plannerType);
  poVar6 = std::operator<<(poVar6,"; Search direction: ");
  poVar6 = std::operator<<(poVar6,(string *)&searchDir);
  std::endl<char,std::char_traits<char>>(poVar6);
  EVar2 = StrToEnvironmentType(environmentType._M_dataplus._M_p);
  PVar3 = StrToPlannerType(plannerType._M_dataplus._M_p);
  strcmp(searchDir._M_dataplus._M_p,"forward");
  if (EVar2 == INVALID_ENV_TYPE || PVar3 == INVALID_PLANNER_TYPE) {
    PrintUsage(argv);
    std::__cxx11::string::~string((string *)&searchDir);
    std::__cxx11::string::~string((string *)&plannerType);
    std::__cxx11::string::~string((string *)&environmentType);
    return 3;
  }
  iVar4 = (*(code *)(&DAT_0010c0c0 + *(int *)(&DAT_0010c0c0 + (ulong)(uint)EVar2 * 4)))();
  return iVar4;
}

Assistant:

int main(int argc, char *argv[])
{
    // Print help
    if (argc == 2 && strcmp(argv[1], "-h") == 0) {
        PrintHelp(argv);
        return MAIN_RESULT_SUCCESS;
    }
    else if (argc < 2) {
        PrintUsage(argv);
        return MAIN_RESULT_INSUFFICIENT_ARGS;
    }

    // Find the number of options passed in; cfg and motprim files come after all options
    // options include any string starting with "-"
    int numOptions = 0;
    for (int i = 1; i < argc; i++) {
        if (strncmp("-", argv[i], 1) == 0) {
            numOptions++;
        }
        else {
            break;
        }
    }

    // Check command line arguments to find environment type and whether or not to
    // use one of the navigating examples.
    bool navigating = CheckIsNavigating(numOptions, argv);
    std::string environmentType = CheckEnvironmentType(numOptions, argv);
    std::string plannerType = CheckPlannerType(numOptions, argv);
    std::string searchDir = CheckSearchDirection(numOptions, argv);

    std::cout << "Environment: " << environmentType << "; Planner: " << plannerType << "; Search direction: "
        << searchDir << std::endl;

    int envArgIdx = numOptions + 1;
    EnvironmentType environment = StrToEnvironmentType(environmentType.c_str());
    PlannerType planner = StrToPlannerType(plannerType.c_str());
    bool forwardSearch = !strcmp(searchDir.c_str(), "forward");

    bool usingMotionPrimitives = (argc == numOptions + 3);
    char* motPrimFilename = usingMotionPrimitives ? argv[envArgIdx + 1] : NULL;

    // make sure we've been given valid a valid environment
    if (environment == INVALID_ENV_TYPE || planner == INVALID_PLANNER_TYPE) {
        PrintUsage(argv);
        return MAIN_RESULT_INCORRECT_OPTIONS;
    }

    // Launch the correct example given the planner and an environment file.
    int plannerRes = 0;
    switch (environment) {
    case ENV_TYPE_2D:
        if (navigating) {
            plannerRes = planandnavigate2d(planner, argv[envArgIdx]);
        }
        else {
            plannerRes = plan2d(planner, argv[envArgIdx], forwardSearch);
        }
        break;
    case ENV_TYPE_2DUU:
        printf("Warning: planning in two dimensions under uncertainty is not fully implemented!\n");
        plannerRes = plan2duu(planner, argv[envArgIdx]);
        break;
    case ENV_TYPE_XYTHETA:
        if (navigating) {
            plannerRes = planandnavigatexythetalat(planner, argv[envArgIdx], motPrimFilename, forwardSearch);
        }
        else {
            plannerRes = planxythetalat(planner, argv[envArgIdx], motPrimFilename, forwardSearch);
        }
        break;
    case ENV_TYPE_XYTHETAMLEV:
        plannerRes = planxythetamlevlat(planner, argv[envArgIdx], motPrimFilename, forwardSearch);
        break;
    case ENV_TYPE_ROBARM:
        plannerRes = planrobarm(planner, argv[envArgIdx], forwardSearch);
        break;
    default:
        printf("Unsupported Environment Type...\n");
        PrintUsage(argv);
        return MAIN_RESULT_UNSUPPORTED_ENV;
    }

    return plannerRes == 1 ? MAIN_RESULT_SUCCESS : MAIN_RESULT_FAILURE;
}